

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_GetBitcoinTransactionTest_Test::TestBody
          (ConfidentialTransaction_GetBitcoinTransactionTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_268;
  Message local_260;
  string local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  Message local_220;
  ByteData local_218;
  undefined1 local_200 [8];
  ByteData conv_rmwit;
  Message local_1e0;
  string local_1d8;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  ByteData local_178;
  undefined1 local_160 [8];
  ByteData conv_wit;
  string local_140;
  undefined1 local_120 [8];
  ByteData witness_data;
  Message local_100;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  Message local_a0 [2];
  ByteData local_90;
  undefined1 local_78 [8];
  ByteData conv_nowit;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  ByteData no_witness_data;
  ConfidentialTransaction_GetBitcoinTransactionTest_Test *this_local;
  
  no_witness_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,
             "010000000136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac00000000"
             ,&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::ByteData::ByteData((ByteData *)local_78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetBitcoinTransaction
                (&local_90,(ByteData *)local_28,false);
      cfd::core::ByteData::operator=((ByteData *)local_78,&local_90);
      cfd::core::ByteData::~ByteData(&local_90);
    }
  }
  else {
    testing::Message::Message(local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x79,
               "Expected: (conv_nowit = ConfidentialTransaction::GetBitcoinTransaction( no_witness_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_a0);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_d8,(ByteData *)local_28);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_f8,(ByteData *)local_78);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_b8,"no_witness_data.GetHex().c_str()","conv_nowit.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &witness_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x7a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &witness_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_100);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &witness_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,
             "02000000000101d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d024730440220533dda726705cbbae9cfb8e7a6ccbce581f3db9bb58ab923e71ae8de0e309280022004614f3bf2b7b11bbd02b382d206b9e0b7cba67c682dd88481f712cca2cc3f9d0121036b67e1bd3bd3efbc37fdc738ab159a4aa527057eae12a0c4b07d3132580dcdfd00000000"
             ,(allocator *)
              ((long)&conv_wit.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_120,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&conv_wit.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_160);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetBitcoinTransaction
                (&local_178,(ByteData *)local_120,false);
      cfd::core::ByteData::operator=((ByteData *)local_160,&local_178);
      cfd::core::ByteData::~ByteData(&local_178);
    }
  }
  else {
    testing::Message::Message(&local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x82,
               "Expected: (conv_wit = ConfidentialTransaction::GetBitcoinTransaction(witness_data, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1b8,(ByteData *)local_120);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1d8,(ByteData *)local_160);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_198,"witness_data.GetHex().c_str()","conv_wit.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &conv_rmwit.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x83,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &conv_rmwit.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &conv_rmwit.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  cfd::core::ByteData::ByteData((ByteData *)local_200);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetBitcoinTransaction
                (&local_218,(ByteData *)local_120,true);
      cfd::core::ByteData::operator=((ByteData *)local_200,&local_218);
      cfd::core::ByteData::~ByteData(&local_218);
    }
  }
  else {
    testing::Message::Message(&local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x88,
               "Expected: (conv_rmwit = ConfidentialTransaction::GetBitcoinTransaction(witness_data, true)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_220);
  }
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_258,(ByteData *)local_200);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_238,
             "\"0200000001d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d00000000\""
             ,"conv_rmwit.GetHex().c_str()",
             "0200000001d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d00000000"
             ,pcVar2);
  std::__cxx11::string::~string((string *)&local_258);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_268,&local_260);
    testing::internal::AssertHelper::~AssertHelper(&local_268);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  cfd::core::ByteData::~ByteData((ByteData *)local_200);
  cfd::core::ByteData::~ByteData((ByteData *)local_160);
  cfd::core::ByteData::~ByteData((ByteData *)local_120);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ByteData::~ByteData((ByteData *)local_28);
  return;
}

Assistant:

TEST(ConfidentialTransaction, GetBitcoinTransactionTest) {
  // no witness
  ByteData no_witness_data(
      "010000000136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac00000000");
  ByteData conv_nowit;
  EXPECT_NO_THROW(
      (conv_nowit = ConfidentialTransaction::GetBitcoinTransaction(
          no_witness_data)));
  EXPECT_STREQ(no_witness_data.GetHex().c_str(), conv_nowit.GetHex().c_str());

  // witness
  ByteData witness_data(
      "02000000000101d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d024730440220533dda726705cbbae9cfb8e7a6ccbce581f3db9bb58ab923e71ae8de0e309280022004614f3bf2b7b11bbd02b382d206b9e0b7cba67c682dd88481f712cca2cc3f9d0121036b67e1bd3bd3efbc37fdc738ab159a4aa527057eae12a0c4b07d3132580dcdfd00000000");
  ByteData conv_wit;
  EXPECT_NO_THROW(
      (conv_wit = ConfidentialTransaction::GetBitcoinTransaction(witness_data,
                                                                 false)));
  EXPECT_STREQ(witness_data.GetHex().c_str(), conv_wit.GetHex().c_str());

  ByteData conv_rmwit;
  EXPECT_NO_THROW(
      (conv_rmwit = ConfidentialTransaction::GetBitcoinTransaction(witness_data,
                                                                   true)));
  EXPECT_STREQ(
      "0200000001d0b871d1a1c019d060e46878e6853c16a886fad7a7bdddcd199b1f4975952dcd0000000000ffffffff01b0069a3b0000000016001405dca32c20abe66ec786bc114fd67ad83e70868d00000000",
      conv_rmwit.GetHex().c_str());
}